

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatserver.cpp
# Opt level: O2

void __thiscall ChatServer::incomingConnection(ChatServer *this,qintptr socketDescriptor)

{
  int *piVar1;
  char cVar2;
  ServerWorker *this_00;
  QThread *this_01;
  iterator iVar3;
  const_iterator cVar4;
  reference piVar5;
  ConnectionType type;
  int iVar6;
  QArrayDataPointer<char16_t> local_e8;
  QArrayDataPointer<char16_t> local_d0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  Object local_98 [8];
  code *local_90;
  Data *local_88;
  ServerWorker *local_80;
  ChatServer *local_78;
  code *local_70;
  ServerWorker **local_68;
  ServerWorker *local_60;
  ChatServer *local_58;
  code *local_50;
  undefined8 local_48;
  int local_40;
  ServerWorker *local_38;
  ChatServer *local_30;
  
  this_00 = (ServerWorker *)operator_new(0x38);
  ServerWorker::ServerWorker(this_00,(QObject *)0x0);
  cVar2 = (**(code **)(*(long *)this_00 + 0x60))(this_00,socketDescriptor);
  if (cVar2 != '\0') {
    iVar6 = (int)(this->m_availableThreads).d.size;
    if (iVar6 < this->m_idealThreadCount) {
      this_01 = (QThread *)operator_new(0x10);
      QThread::QThread(this_01,(QObject *)this);
      QList<QThread_*>::append(&this->m_availableThreads,this_01);
      QList<int>::append(&this->m_threadsLoad,1);
      iVar3 = QList<QThread_*>::end(&this->m_availableThreads);
      QThread::start(iVar3.i[-1],7);
    }
    else {
      piVar1 = (this->m_threadsLoad).d.ptr;
      cVar4 = std::__min_element<QList<int>::const_iterator,__gnu_cxx::__ops::_Iter_less_iter>
                        (piVar1,piVar1 + (this->m_threadsLoad).d.size);
      iVar6 = (int)((ulong)((long)cVar4.i - (long)piVar1) >> 2);
      piVar5 = QList<int>::operator[](&this->m_threadsLoad,(long)iVar6);
      *piVar5 = *piVar5 + 1;
    }
    QObject::moveToThread((QThread *)this_00);
    local_d0.d = (Data *)QObject::deleteLater;
    local_d0.ptr = (char16_t *)0x0;
    QObject::connect<void(QThread::*)(QThread::QPrivateSignal),void(QObject::*)()>
              (local_98,(offset_in_QThread_to_subr)(this->m_availableThreads).d.ptr[iVar6],
               (Object *)QThread::finished,0,(ConnectionType)this_00);
    QMetaObject::Connection::~Connection((Connection *)local_98);
    local_50 = userDisconnected;
    local_48 = 0;
    type = (ConnectionType)this;
    local_40 = iVar6;
    local_38 = this_00;
    local_30 = this;
    QObject::
    connect<void(ServerWorker::*)(),std::_Bind<void(ChatServer::*(ChatServer*,ServerWorker*,int))(ServerWorker*,int)>>
              ((Object *)(local_a8 + 8),(Function)this_00,
               (QObject *)ServerWorker::disconnectedFromClient,
               (_Bind<void_(ChatServer::*(ChatServer_*,_ServerWorker_*,_int))(ServerWorker_*,_int)>
                *)0x0,type);
    QMetaObject::Connection::~Connection((Connection *)(local_a8 + 8));
    local_70 = userError;
    local_68 = (ServerWorker **)0x0;
    local_60 = this_00;
    local_58 = this;
    QObject::
    connect<void(ServerWorker::*)(),std::_Bind<void(ChatServer::*(ChatServer*,ServerWorker*))(ServerWorker*)>>
              ((Object *)local_a8,(Function)this_00,(QObject *)ServerWorker::error,
               (_Bind<void_(ChatServer::*(ChatServer_*,_ServerWorker_*))(ServerWorker_*)> *)0x0,type
              );
    QMetaObject::Connection::~Connection((Connection *)local_a8);
    local_90 = jsonReceived;
    local_88 = (Data *)0x0;
    local_80 = this_00;
    local_78 = this;
    QObject::
    connect<void(ServerWorker::*)(QJsonObject_const&),std::_Bind<void(ChatServer::*(ChatServer*,ServerWorker*,std::_Placeholder<1>))(ServerWorker*,QJsonObject_const&)>>
              ((Object *)(local_b8 + 8),(offset_in_ServerWorker_to_subr)this_00,
               (QObject *)ServerWorker::jsonReceived,
               (_Bind<void_(ChatServer::*(ChatServer_*,_ServerWorker_*,_std::_Placeholder<1>))(ServerWorker_*,_const_QJsonObject_&)>
                *)0x0,type);
    QMetaObject::Connection::~Connection((Connection *)(local_b8 + 8));
    local_d0.d = (Data *)ServerWorker::disconnectFromClient;
    local_d0.ptr = (char16_t *)0x0;
    QObject::connect<void(ChatServer::*)(),void(ServerWorker::*)()>
              ((Object *)local_b8,(offset_in_ChatServer_to_subr)this,(Object *)stopAllClients,0,
               (ConnectionType)this_00);
    QMetaObject::Connection::~Connection((Connection *)local_b8);
    QList<ServerWorker_*>::append(&this->m_clients,this_00);
    local_d0.d = (Data *)0x0;
    local_d0.ptr = L"New client Connected";
    local_d0.size = 0x14;
    local_e8.d = (Data *)0x0;
    local_e8.ptr = (char16_t *)0x0;
    local_e8.size = 0;
    logMessage(this,(QString *)&local_d0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
    return;
  }
  QObject::deleteLater();
  return;
}

Assistant:

void ChatServer::incomingConnection(qintptr socketDescriptor)
{
    ServerWorker *worker = new ServerWorker;
    if (!worker->setSocketDescriptor(socketDescriptor)) {
        worker->deleteLater();
        return;
    }
    int threadIdx = m_availableThreads.size();
    if (threadIdx < m_idealThreadCount) { //we can add a new thread
        m_availableThreads.append(new QThread(this));
        m_threadsLoad.append(1);
        m_availableThreads.last()->start();
    } else {
        // find the thread with the least amount of clients and use it
        threadIdx = std::distance(m_threadsLoad.cbegin(), std::min_element(m_threadsLoad.cbegin(), m_threadsLoad.cend()));
        ++m_threadsLoad[threadIdx];
    }
    worker->moveToThread(m_availableThreads.at(threadIdx));
    connect(m_availableThreads.at(threadIdx), &QThread::finished, worker, &QObject::deleteLater);
    connect(worker, &ServerWorker::disconnectedFromClient, this, std::bind(&ChatServer::userDisconnected, this, worker, threadIdx));
    connect(worker, &ServerWorker::error, this, std::bind(&ChatServer::userError, this, worker));
    connect(worker, &ServerWorker::jsonReceived, this, std::bind(&ChatServer::jsonReceived, this, worker, std::placeholders::_1));
    connect(this, &ChatServer::stopAllClients, worker, &ServerWorker::disconnectFromClient);
    m_clients.append(worker);
    emit logMessage(QStringLiteral("New client Connected"));
}